

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImDrawList * GetViewportDrawList(ImGuiViewportP *viewport,size_t drawlist_no,char *drawlist_name)

{
  int *piVar1;
  ImVec2 cr_min;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  ImDrawList *this;
  ImGuiContext *ctx;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  ImVec2 cr_max;
  undefined1 auVar5 [32];
  
  pIVar3 = GImGui;
  this = viewport->DrawLists[drawlist_no];
  if (this == (ImDrawList *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    this = (ImDrawList *)(*GImAllocatorAllocFunc)(200,GImAllocatorUserData);
    auVar5 = ZEXT1632(ZEXT816(0) << 0x40);
    auVar4 = auVar5._0_16_;
    (this->VtxBuffer).Size = auVar4._0_4_;
    (this->VtxBuffer).Capacity = auVar4._4_4_;
    (this->VtxBuffer).Data = (ImDrawVert *)auVar4._8_8_;
    this->Flags = auVar5._16_4_;
    this->_VtxCurrentIdx = auVar5._20_4_;
    this->_Data = (ImDrawListSharedData *)auVar5._24_8_;
    this->_OwnerName = (char *)auVar5._0_8_;
    this->_VtxWritePtr = (ImDrawVert *)auVar5._8_8_;
    this->_IdxWritePtr = (ImDrawIdx *)auVar5._16_8_;
    (this->_ClipRectStack).Size = auVar5._24_4_;
    (this->_ClipRectStack).Capacity = auVar5._28_4_;
    auVar5 = ZEXT1632(ZEXT816(0) << 0x40);
    auVar4 = auVar5._0_16_;
    auVar6 = auVar5._16_16_;
    (this->CmdBuffer).Size = auVar4._0_4_;
    (this->CmdBuffer).Capacity = auVar4._4_4_;
    (this->CmdBuffer).Data = (ImDrawCmd *)auVar4._8_8_;
    (this->IdxBuffer).Size = auVar6._0_4_;
    (this->IdxBuffer).Capacity = auVar6._4_4_;
    (this->IdxBuffer).Data = (unsigned_short *)auVar6._8_8_;
    *(undefined1 (*) [32])&(this->_ClipRectStack).Data = auVar5;
    *(undefined1 (*) [32])&(this->_Path).Data = auVar5;
    *(undefined1 (*) [32])&(this->_CmdHeader).VtxOffset = auVar5;
    *(undefined8 *)&this->_FringeScale = 0;
    this->_Data = &pIVar3->DrawListSharedData;
    this->_OwnerName = drawlist_name;
    viewport->DrawLists[drawlist_no] = this;
  }
  if (viewport->DrawListsLastFrame[drawlist_no] != pIVar3->FrameCount) {
    ImDrawList::_ResetForNewFrame(this);
    ImDrawList::PushTextureID(this,((pIVar3->IO).Fonts)->TexID);
    cr_min = (viewport->super_ImGuiViewport).Pos;
    IVar2 = (viewport->super_ImGuiViewport).Size;
    cr_max.x = cr_min.x + IVar2.x;
    cr_max.y = cr_min.y + IVar2.y;
    ImDrawList::PushClipRect(this,cr_min,cr_max,false);
    viewport->DrawListsLastFrame[drawlist_no] = pIVar3->FrameCount;
  }
  return this;
}

Assistant:

static ImDrawList* GetViewportDrawList(ImGuiViewportP* viewport, size_t drawlist_no, const char* drawlist_name)
{
    // Create the draw list on demand, because they are not frequently used for all viewports
    ImGuiContext& g = *GImGui;
    IM_ASSERT(drawlist_no < IM_ARRAYSIZE(viewport->DrawLists));
    ImDrawList* draw_list = viewport->DrawLists[drawlist_no];
    if (draw_list == NULL)
    {
        draw_list = IM_NEW(ImDrawList)(&g.DrawListSharedData);
        draw_list->_OwnerName = drawlist_name;
        viewport->DrawLists[drawlist_no] = draw_list;
    }

    // Our ImDrawList system requires that there is always a command
    if (viewport->DrawListsLastFrame[drawlist_no] != g.FrameCount)
    {
        draw_list->_ResetForNewFrame();
        draw_list->PushTextureID(g.IO.Fonts->TexID);
        draw_list->PushClipRect(viewport->Pos, viewport->Pos + viewport->Size, false);
        viewport->DrawListsLastFrame[drawlist_no] = g.FrameCount;
    }
    return draw_list;
}